

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void RGB565ToARGBRow_C(uint8_t *src_rgb565,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  if (0 < width) {
    lVar3 = 0;
    do {
      bVar1 = src_rgb565[lVar3 * 2];
      bVar2 = src_rgb565[lVar3 * 2 + 1];
      dst_argb[lVar3 * 4] = bVar1 >> 2 & 7 | bVar1 * '\b';
      dst_argb[lVar3 * 4 + 1] = bVar2 >> 1 & 3 | bVar1 >> 3 & 0x1c | bVar2 << 5;
      dst_argb[lVar3 * 4 + 2] = bVar2 & 0xf8 | bVar2 >> 5;
      dst_argb[lVar3 * 4 + 3] = 0xff;
      lVar3 = lVar3 + 1;
    } while (width != (int)lVar3);
  }
  return;
}

Assistant:

void RGB565ToARGBRow_C(const uint8_t* src_rgb565,
                       uint8_t* dst_argb,
                       int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    dst_argb[0] = (b << 3) | (b >> 2);
    dst_argb[1] = (g << 2) | (g >> 4);
    dst_argb[2] = (r << 3) | (r >> 2);
    dst_argb[3] = 255u;
    dst_argb += 4;
    src_rgb565 += 2;
  }
}